

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2mconv.cpp
# Opt level: O2

int CheckV2MVersion(uchar *inptr,int inlen,ssbase *base)

{
  byte *pbVar1;
  uint8_t *puVar2;
  uint32_t uVar3;
  uint8_t *puVar4;
  undefined1 *puVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  uint *puVar9;
  int *piVar10;
  int iVar11;
  byte bVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  bool bVar23;
  undefined1 auStack_ac8 [8];
  uint local_ac0;
  int local_abc;
  ssbase base_1;
  
  memset(&base_1,0,0xa60);
  if (0xb < inlen) {
    base_1.timediv = *(uint32_t *)inptr;
    base_1.timediv2 = base_1.timediv * 10000;
    base_1.maxtime = *(uint32_t *)(inptr + 4);
    base_1.gdnum = *(uint32_t *)(inptr + 8);
    base_1.gptr = inptr + 0xc;
    if (base_1.gdnum * 10 <= inlen - 0xcU) {
      puVar9 = (uint *)(base_1.gptr + base_1.gdnum * 10);
      puVar5 = auStack_ac8;
      for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 1) {
        uVar17 = *puVar9;
        base_1.chan[lVar14].notenum = uVar17;
        puVar9 = puVar9 + 1;
        if (uVar17 != 0) {
          base_1.chan[lVar14].noteptr = (uint8_t *)puVar9;
          uVar18 = (ulong)(uVar17 * 5);
          uVar3 = *(uint32_t *)((long)puVar9 + uVar18);
          base_1.chan[lVar14].pcnum = uVar3;
          base_1.chan[lVar14].pcptr = (uint8_t *)((uint32_t *)((long)puVar9 + uVar18) + 1);
          uVar22 = (ulong)(uVar3 << 2);
          puVar2 = (uint8_t *)((long)puVar9 + uVar22 + 8 + uVar18);
          uVar3 = *(uint32_t *)(puVar2 + -4);
          base_1.chan[lVar14].pbnum = uVar3;
          base_1.chan[lVar14].pbptr = puVar2;
          puVar9 = (uint *)((long)puVar9 + (ulong)(uVar3 * 5) + uVar22 + uVar18 + 8);
          for (lVar16 = 0; lVar16 != 0x70; lVar16 = lVar16 + 0x10) {
            uVar17 = *puVar9;
            *(uint *)(puVar5 + lVar16 + 0x98) = uVar17;
            *(uint **)(puVar5 + 0xa0 + lVar16) = puVar9 + 1;
            puVar9 = (uint *)((long)puVar9 + (ulong)(uVar17 << 2) + 4);
          }
        }
        puVar5 = puVar5 + 0xa0;
      }
      base_1.midisize = (int)puVar9 - (int)inptr;
      base_1.globsize = *puVar9;
      uVar18 = (ulong)(uint)base_1.globsize;
      if (uVar18 < 0x20001) {
        base_1.globals = (uint8_t *)(puVar9 + 1);
        base_1.patchsize = *(uint *)((long)puVar9 + uVar18 + 4);
        if ((ulong)(uint)base_1.patchsize < 0x100001) {
          base_1.patchmap = (uint8_t *)((long)puVar9 + uVar18 + 8);
          lVar14 = (uint)base_1.patchsize + uVar18;
          piVar10 = (int *)((long)puVar9 + lVar14 + 8);
          if ((long)piVar10 - (long)inptr < (long)(ulong)(uint)inlen) {
            base_1.spsize = *piVar10;
            base_1.speechdata = (uint8_t *)((long)puVar9 + lVar14 + 0xc);
            if ((long)((long)piVar10 + (((long)base_1.spsize + 4U) - (long)inptr)) <=
                (long)(ulong)(uint)inlen && (ulong)(long)base_1.spsize < 0x2001) goto LAB_001083be;
          }
          base_1.spsize = 0;
          base_1.speechdata = (uint8_t *)0x0;
        }
      }
    }
  }
LAB_001083be:
  memcpy(base,&base_1,0xa60);
  local_abc = -1;
  if (base->patchsize != 0) {
    base->maxp = 0;
    uVar17 = 0;
    local_ac0 = 0;
    for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 1) {
      uVar15 = base->chan[lVar14].pcnum;
      lVar16 = (long)(int)uVar15;
      uVar3 = base->chan[lVar14].notenum;
      uVar22 = 0;
      uVar18 = 0;
      if (0 < (int)uVar15) {
        uVar18 = (ulong)uVar15;
      }
      bVar12 = 0;
      iVar11 = 0;
      lVar21 = 0;
      iVar8 = 0;
      while( true ) {
        uVar15 = (uint)bVar12;
        if (uVar22 == uVar18) break;
        puVar2 = base->chan[lVar14].pcptr;
        iVar11 = iVar11 + ((uint)puVar2[uVar22] |
                          (uint)puVar2[lVar16 + uVar22] << 8 |
                          (uint)puVar2[lVar16 * 2 + uVar22] << 0x10);
        if ((iVar8 < iVar11) && (local_ac0 <= uVar15)) {
          local_ac0 = uVar15 + 1;
          base->maxp = local_ac0;
          uVar17 = local_ac0;
        }
        lVar21 = (long)(int)lVar21;
        for (; (lVar21 < (int)uVar3 && (iVar8 <= iVar11));
            iVar8 = iVar8 + ((uint)*pbVar1 | (uint)puVar4[lVar7] << 8 | (uint)puVar4[lVar6] << 0x10)
            ) {
          puVar4 = base->chan[lVar14].noteptr;
          lVar6 = (int)(uVar3 * 2) + lVar21;
          lVar7 = (int)uVar3 + lVar21;
          pbVar1 = puVar4 + lVar21;
          lVar21 = lVar21 + 1;
        }
        bVar12 = bVar12 + puVar2[lVar16 * 3 + uVar22];
        uVar22 = uVar22 + 1;
      }
      if (((int)lVar21 < (int)uVar3) && (local_ac0 <= uVar15)) {
        local_ac0 = uVar15 + 1;
        base->maxp = local_ac0;
        uVar17 = local_ac0;
      }
    }
    if (uVar17 != 0) {
      puVar2 = base->patchmap;
      uVar17 = uVar17 - 1;
      uVar18 = 0;
      uVar22 = 0;
      if (0 < (int)uVar17) {
        uVar22 = (ulong)uVar17;
      }
      uVar13 = 0xffffffffffffffff;
      iVar8 = 0;
      for (; (long)uVar18 <= (long)v2version; uVar18 = uVar18 + 1) {
        if (base->globsize == v2gsizes[uVar18]) {
          uVar19 = 0;
          do {
            uVar20 = uVar22;
            if (uVar22 == uVar19) goto LAB_001085da;
            lVar14 = uVar19 * 4;
            iVar11 = (*(int *)(puVar2 + uVar19 * 4 + 4) -
                     (*(int *)(puVar2 + lVar14) + v2vsizes[uVar18])) + 0x2fd;
            uVar20 = uVar19;
            if (iVar11 % 3 != 0) goto LAB_001085da;
            uVar19 = uVar19 + 1;
          } while (iVar11 / 3 ==
                   (uint)puVar2[(*(int *)(puVar2 + lVar14) + v2vsizes[uVar18]) - 0x2fe]);
          uVar20 = (ulong)((int)uVar19 - 1);
LAB_001085da:
          bVar23 = (uint)uVar20 == uVar17;
          if (bVar23) {
            uVar13 = uVar18;
          }
          uVar13 = uVar13 & 0xffffffff;
          iVar8 = iVar8 + (uint)bVar23;
        }
      }
      local_abc = -2;
      if (0 < iVar8) {
        local_abc = v2version - (int)uVar13;
      }
    }
  }
  return local_abc;
}

Assistant:

int CheckV2MVersion(const unsigned char *inptr, const int inlen, ssbase& base)
{
    int i;
    int patchesused[128];
    base = readfile(inptr,inlen);

    if (!base.patchsize)
        return -1;

    // determine highest used patch from progchange commands
    // (midiconv remaps the patches so that they're a
    //  continuous block from 0 to x)
    memset(patchesused, 0, sizeof(patchesused));
    base.maxp = 0;


    for (int ch = 0; ch < 16; ch++)
    {
        unsigned char p = 0;
        unsigned char v = 0;

        //int pcp = 0;
        int pct = 0;
        int pcn = base.chan[ch].pcnum;
        int np = 0;
        int nt = 0;
        int nn = base.chan[ch].notenum;

        int td;
        const uint8_t *ptr;
        for (int pcp = 0; pcp < pcn; pcp++)
        {
            // have there been notes? add last pgm
            ptr = base.chan[ch].pcptr;
            td  = 0x10000*ptr[2*pcn + pcp] + 0x100*ptr[1*pcn + pcp] + ptr[0*pcn + pcp];
            pct += td;
            if (pct > nt)
            {
                patchesused[p] = 1;
                if (p >= base.maxp) base.maxp = p + 1;
            }
            p += ptr[3*pcn + pcp];

            // walk notes until we reach current cmd
            while (np < nn && nt <= pct)
            {
                ptr = base.chan[ch].noteptr;
                td  = 0x10000*ptr[2*nn + np] + 0x100*ptr[1*nn + np] + ptr[0*nn + np];
                v  += ptr[4*nn+np];
                nt += td;
                np++;
            }
        }

        if (np < nn)
        {
            patchesused[p] = 1;
            if (p >= base.maxp) base.maxp = p + 1;
        }

    }
    printf2("patches used: %d\n", base.maxp);

    if (!base.maxp)
        return -1;

    // offset table to ptaches
    uint32_t *poffsets = (uint32_t *)base.patchmap;

    int matches = 0, best = -1;
    // for each version check...
    for (i = 0; i <= v2version; i++)
    {
        // ... if globals size is correct...
        if (base.globsize == v2gsizes[i])
        {
            printf2("globsize match: %d\n",i);
            // ... and if the size of all patches makes sense
            int p;
            for (p = 0; p < base.maxp - 1; p++)
            {
                int d = (poffsets[p + 1] - poffsets[p]) - (v2vsizes[i] - 3*255);
                if (d % 3) break;
                d /= 3;
                if (d != base.patchmap[poffsets[p] + v2vsizes[i] - 3*255 - 1])
                    break;
            }

            if (p == base.maxp - 1)
            {
                printf2("... ok!\n");
                best = i;
                matches++;
            } else
            {
                printf2("no match!\n");
            }
        }
    }

    // if we've got exactly one match, we're quite sure
    int ret = (matches >= 1) ? v2version - best : -2;
    printf2("found version delta: %d\n", ret);
    return ret;
}